

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O1

void __thiscall
should_visit_unknown_tags_in_non_strict_mode::Visitor::
checkUnparsed<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>>
          (Visitor *this,
          InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
          *message,int tag,char *value)

{
  bool bVar1;
  undefined4 in_register_00000014;
  char *pcVar2;
  char *local_68;
  char *value_local;
  Unparsed *it;
  string str;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar_1;
  
  local_68 = value;
  value_local = (char *)std::
                        __find_if<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>::Unparsed_const*,__gnu_cxx::__ops::_Iter_pred<should_visit_unknown_tags_in_non_strict_mode::Visitor::checkUnparsed<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>>(Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>const&,int,char_const*)::_lambda(Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>::Unparsed_const&)_1_>>
                                  ((message->
                                   super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
                                   ).unparsed.
                                   super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed>
                                   .
                                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_false>
                                   .
                                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
                                   .super_SmallVectorBase.BeginX,
                                   (message->
                                   super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
                                   ).unparsed.
                                   super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed>
                                   .
                                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_false>
                                   .
                                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
                                   .super_SmallVectorBase.EndX,CONCAT44(in_register_00000014,tag));
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (message->
       super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
       ).unparsed.
       super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed>
       .
       super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_false>
       .
       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_void>
       .super_SmallVectorBase.EndX;
  testing::internal::
  CmpHelperNE<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>::Unparsed_const*,Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>::Unparsed_const*>
            ((internal *)&it,"it","message.unparsed.end()",(Unparsed **)&value_local,
             (Unparsed **)&local_30);
  if ((char)it == '\0') {
    testing::Message::Message((Message *)&local_30);
    if (str._M_dataplus._M_p == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)str._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x1a6,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    it = (Unparsed *)&str._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&it,*(long *)(value_local + 8),
               *(long *)(value_local + 0x10) + *(long *)(value_local + 8));
    testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
              ((internal *)&local_30,"str","value",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,&local_68);
    if (local_30.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar_1.message_);
      if (gtest_ar_1._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_1._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)((long)&str.field_2 + 8),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x1aa,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)((long)&str.field_2 + 8),(Message *)&gtest_ar_1.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&str.field_2 + 8));
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (gtest_ar_1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar_1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (it != (Unparsed *)&str._M_string_length) {
      operator_delete(it,str._M_string_length + 1);
    }
  }
  return;
}

Assistant:

void checkUnparsed(const Message& message, int tag, const char* value)
        {
            auto it = std::find_if(
                std::begin(message.unparsed), std::end(message.unparsed),
                [=](const typename Message::Unparsed& unparsed) { return unparsed.tag == tag; }
            );

            ASSERT_NE(it, message.unparsed.end());

            auto view = it->view;
            std::string str(view.first, view.second);
            ASSERT_EQ(str, value);
        }